

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::Parser::Parser(Parser *this,uint32_t *spirv_data,size_t word_count)

{
  allocator_type local_41;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  ParsedIR::ParsedIR(&this->ir);
  (this->global_struct_cache).super_VectorView<unsigned_int>.buffer_size = 0;
  this->current_function = (SPIRFunction *)0x0;
  this->current_block = (SPIRBlock *)0x0;
  this->ignore_trailing_block_opcodes = false;
  (this->global_struct_cache).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->global_struct_cache).stack_storage;
  (this->global_struct_cache).buffer_capacity = 8;
  (this->forward_pointer_fixups).super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.
  buffer_size = 0;
  (this->forward_pointer_fixups).super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.ptr =
       (pair<unsigned_int,_unsigned_int> *)&(this->forward_pointer_fixups).stack_storage;
  (this->forward_pointer_fixups).buffer_capacity = 8;
  ::std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_40,spirv_data,
             spirv_data + word_count,&local_41);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&(this->ir).spirv,&local_40);
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

Parser::Parser(const uint32_t *spirv_data, size_t word_count)
{
	ir.spirv = vector<uint32_t>(spirv_data, spirv_data + word_count);
}